

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::clusterizer<crnlib::vec<2U,_float>_>::generate_codebook
          (clusterizer<crnlib::vec<2U,_float>_> *this,uint max_size,
          progress_callback_func_ptr pProgress_callback,void *pProgress_data,bool quick)

{
  node_vec_type *this_00;
  vector<unsigned_int> *this_01;
  uint *puVar1;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  pair<crnlib::vec<2U,_float>,_unsigned_int> *ppVar6;
  vq_node *pvVar7;
  void *p;
  uint *puVar8;
  vec<2U,_float> *p_00;
  bool bVar9;
  float fVar10;
  uint i_1;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  float fVar19;
  vq_node root;
  vec<2U,_float> result;
  float local_98 [2];
  ulong uStack_90;
  float local_88;
  vector<unsigned_int> local_80;
  undefined5 local_70;
  undefined3 uStack_6b;
  undefined4 local_68;
  undefined1 local_64;
  vector<unsigned_int> *local_58;
  vector<unsigned_int> *local_50;
  progress_callback_func_ptr local_48;
  void *local_40;
  float afStack_38 [2];
  
  uVar5 = (this->m_training_vecs).m_size;
  if (uVar5 == 0) {
    return false;
  }
  this->m_quick = quick;
  local_80.m_p = (uint *)0x0;
  local_80.m_size = 0;
  local_80.m_capacity = 0;
  local_98[0] = 0.0;
  local_98[1] = 0.0;
  uStack_90 = 0;
  local_70 = 0xffffffffff;
  uStack_6b = 0xffffff;
  local_68 = 0xffffffff;
  local_64 = 0;
  local_48 = pProgress_callback;
  local_40 = pProgress_data;
  vector<unsigned_int>::reserve(&local_80,uVar5);
  if ((this->m_training_vecs).m_size == 0) {
    fVar10 = 0.0;
  }
  else {
    fVar10 = 0.0;
    lVar17 = 0;
    uVar14 = 0;
    do {
      ppVar6 = (this->m_training_vecs).m_p;
      ppVar2 = ppVar6 + uVar14;
      uVar16 = ppVar2->second;
      fVar19 = (float)uVar16;
      lVar12 = 0;
      do {
        afStack_38[lVar12] = *(float *)((long)(ppVar6->first).m_s + lVar12 * 4 + lVar17) * fVar19;
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      lVar12 = 0;
      do {
        local_98[lVar12] = afStack_38[lVar12] + local_98[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      uStack_90 = uStack_90 + uVar16;
      if (local_80.m_capacity <= local_80.m_size) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&local_80,local_80.m_size + 1,true,4,(object_mover)0x0,false)
        ;
      }
      local_80.m_p[local_80._8_8_ & 0xffffffff] = (uint)uVar14;
      local_80.m_size = local_80.m_size + 1;
      fVar3 = (ppVar2->first).m_s[0];
      fVar4 = (ppVar2->first).m_s[1];
      fVar10 = fVar10 + (fVar4 * fVar4 + fVar3 * fVar3) * fVar19;
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0xc;
    } while (uVar14 < (this->m_training_vecs).m_size);
  }
  local_88 = fVar10 - (local_98[1] * local_98[1] + local_98[0] * local_98[0]) / (float)uStack_90;
  lVar17 = 0;
  do {
    local_98[lVar17] = local_98[lVar17] * (1.0 / (float)uStack_90);
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  this_00 = &this->m_nodes;
  pvVar7 = (this->m_nodes).m_p;
  if (pvVar7 != (vq_node *)0x0) {
    uVar14 = (ulong)(this->m_nodes).m_size;
    if (uVar14 != 0) {
      lVar17 = 0;
      do {
        p = *(void **)((long)&((vector<unsigned_int> *)(&pvVar7->m_centroid + 3))->m_p + lVar17);
        if (p != (void *)0x0) {
          crnlib_free(p);
        }
        lVar17 = lVar17 + 0x38;
      } while (uVar14 * 0x38 - lVar17 != 0);
    }
    crnlib_free(this_00->m_p);
    this_00->m_p = (vq_node *)0x0;
    (this->m_nodes).m_size = 0;
    (this->m_nodes).m_capacity = 0;
  }
  vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::reserve(this_00,max_size * 2 + 1);
  uVar16 = (this->m_nodes).m_size;
  if ((this->m_nodes).m_capacity <= uVar16) {
    elemental_vector::increase_capacity
              ((elemental_vector *)this_00,uVar16 + 1,true,0x38,
               vector<crnlib::clusterizer<crnlib::vec<2U,_float>_>::vq_node>::object_mover,false);
  }
  uVar16 = (this->m_nodes).m_size;
  pvVar7 = (this->m_nodes).m_p;
  lVar17 = 0;
  do {
    pvVar7[uVar16].m_centroid.m_s[lVar17] = local_98[lVar17];
    lVar17 = lVar17 + 1;
  } while (lVar17 == 1);
  pvVar7[uVar16].m_variance = local_88;
  pvVar7[uVar16].m_total_weight = uStack_90;
  pvVar7[uVar16].m_vectors.m_p = (uint *)0x0;
  pvVar7[uVar16].m_vectors.m_size = 0;
  pvVar7[uVar16].m_vectors.m_capacity = 0;
  elemental_vector::increase_capacity
            ((elemental_vector *)&pvVar7[uVar16].m_vectors,local_80.m_size,false,4,(object_mover)0x0
             ,false);
  pvVar7[uVar16].m_vectors.m_size = local_80.m_size;
  memcpy(pvVar7[uVar16].m_vectors.m_p,local_80.m_p,(local_80._8_8_ & 0xffffffff) << 2);
  pvVar7[uVar16].m_left = (int)local_70;
  pvVar7[uVar16].m_right = (int)(CONCAT35(uStack_6b,local_70) >> 0x20);
  *(ulong *)((long)&pvVar7[uVar16].m_right + 1) = CONCAT17(local_64,CONCAT43(local_68,uStack_6b));
  puVar1 = &(this->m_nodes).m_size;
  *puVar1 = *puVar1 + 1;
  this_01 = &this->m_heap;
  uVar13 = max_size + 1;
  uVar16 = (this->m_heap).m_size;
  if (uVar16 != uVar13) {
    if (uVar16 <= uVar13) {
      if ((this->m_heap).m_capacity < uVar13) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this_01,uVar13,uVar16 == max_size,4,(object_mover)0x0,false);
      }
      uVar16 = (this->m_heap).m_size;
      memset((this->m_heap).m_p + uVar16,0,(ulong)(uVar13 - uVar16) << 2);
    }
    (this->m_heap).m_size = uVar13;
  }
  (this->m_heap).m_p[1] = 0;
  this->m_heap_size = 1;
  this->m_split_index = 0;
  local_50 = &this->m_left_children;
  vector<unsigned_int>::reserve(local_50,(this->m_training_vecs).m_size + 1);
  local_58 = &this->m_right_children;
  vector<unsigned_int>::reserve(local_58,(this->m_training_vecs).m_size + 1);
  uVar15 = (max_size >> 1) + 200;
  uVar16 = 0xffffffff;
  uVar13 = 2;
  while( true ) {
    bVar18 = max_size <= uVar13 - 1;
    uVar11 = this->m_heap_size;
    bVar9 = uVar11 == 0 || bVar18;
    if (uVar11 == 0 || bVar18) break;
    puVar8 = (this->m_heap).m_p;
    uVar5 = puVar8[1];
    puVar8[1] = puVar8[uVar11];
    puVar1 = &this->m_heap_size;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 != 0) {
      down_heap(this,1);
    }
    split_node(this,uVar5);
    bVar18 = true;
    if ((((uVar13 & 0x3f) == 0 && local_48 != (progress_callback_func_ptr)0x0) &&
        (uVar11 = uVar15 / max_size, uVar11 != uVar16)) &&
       (bVar18 = (*local_48)(uVar11,local_40), bVar18)) {
      uVar16 = uVar11;
    }
    uVar13 = uVar13 + 1;
    uVar15 = uVar15 + 100;
    if (bVar18 == false) goto LAB_001423d1;
  }
  p_00 = (this->m_codebook).m_p;
  if (p_00 != (vec<2U,_float> *)0x0) {
    crnlib_free(p_00);
    (this->m_codebook).m_p = (vec<2U,_float> *)0x0;
    (this->m_codebook).m_size = 0;
    (this->m_codebook).m_capacity = 0;
  }
  this->m_overall_variance = 0.0;
  if ((this->m_nodes).m_size != 0) {
    lVar17 = 0x30;
    uVar14 = 0;
    do {
      pvVar7 = this_00->m_p;
      if (*(int *)((long)(&pvVar7->m_centroid + -1) + lVar17) == -1) {
        uVar16 = (this->m_codebook).m_size;
        *(uint *)((long)(pvVar7->m_centroid).m_s + lVar17) = uVar16;
        if ((this->m_codebook).m_capacity <= uVar16) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_codebook,uVar16 + 1,true,8,(object_mover)0x0,false
                    );
        }
        *(undefined8 *)(this->m_codebook).m_p[(this->m_codebook).m_size].m_s =
             *(undefined8 *)((long)(&pvVar7->m_centroid + -6) + lVar17);
        puVar1 = &(this->m_codebook).m_size;
        *puVar1 = *puVar1 + 1;
        this->m_overall_variance =
             *(float *)((long)(&pvVar7->m_centroid + -4) + lVar17) + this->m_overall_variance;
      }
      uVar14 = uVar14 + 1;
      lVar17 = lVar17 + 0x38;
    } while (uVar14 < (this->m_nodes).m_size);
  }
  if (this_01->m_p != (uint *)0x0) {
    crnlib_free(this_01->m_p);
    this_01->m_p = (uint *)0x0;
    (this->m_heap).m_size = 0;
    (this->m_heap).m_capacity = 0;
  }
  if (local_50->m_p != (uint *)0x0) {
    crnlib_free(local_50->m_p);
    local_50->m_p = (uint *)0x0;
    local_50->m_size = 0;
    local_50->m_capacity = 0;
  }
  if (local_58->m_p != (uint *)0x0) {
    crnlib_free(local_58->m_p);
    local_58->m_p = (uint *)0x0;
    local_58->m_size = 0;
    local_58->m_capacity = 0;
  }
LAB_001423d1:
  if (local_80.m_p == (uint *)0x0) {
    return bVar9;
  }
  crnlib_free(local_80.m_p);
  return bVar9;
}

Assistant:

bool generate_codebook(uint max_size, progress_callback_func_ptr pProgress_callback = nullptr, void* pProgress_data = nullptr, bool quick = false)
        {
            if (m_training_vecs.empty())
            {
                return false;
            }

            m_quick = quick;

            double ttsum = 0.0f;

            vq_node root;
            root.m_vectors.reserve(m_training_vecs.size());

            for (uint i = 0; i < m_training_vecs.size(); i++)
            {
                const VectorType& v = m_training_vecs[i].first;
                const uint weight = m_training_vecs[i].second;

                root.m_centroid += (v * (float)weight);
                root.m_total_weight += weight;
                root.m_vectors.push_back(i);

                ttsum += v.dot(v) * weight;
            }

            root.m_variance = (float)(ttsum - (root.m_centroid.dot(root.m_centroid) / root.m_total_weight));

            root.m_centroid *= (1.0f / root.m_total_weight);

            m_nodes.clear();
            m_nodes.reserve(max_size * 2 + 1);

            m_nodes.push_back(root);

            m_heap.resize(max_size + 1);
            m_heap[1] = 0;
            m_heap_size = 1;

            m_split_index = 0;

            uint total_leaves = 1;

            m_left_children.reserve(m_training_vecs.size() + 1);
            m_right_children.reserve(m_training_vecs.size() + 1);

            int prev_percentage = -1;
            while ((total_leaves < max_size) && (m_heap_size))
            {
                int worst_node_index = m_heap[1];

                m_heap[1] = m_heap[m_heap_size];
                m_heap_size--;
                if (m_heap_size)
                {
                    down_heap(1);
                }

                split_node(worst_node_index);
                total_leaves++;

                if ((pProgress_callback) && ((total_leaves & 63) == 0) && (max_size))
                {
                    int cur_percentage = (total_leaves * 100U + (max_size / 2U)) / max_size;
                    if (cur_percentage != prev_percentage)
                    {
                        if (!(*pProgress_callback)(cur_percentage, pProgress_data))
                        {
                            return false;
                        }

                        prev_percentage = cur_percentage;
                    }
                }
            }

            m_codebook.clear();

            m_overall_variance = 0.0f;

            for (uint i = 0; i < m_nodes.size(); i++)
            {
                vq_node& node = m_nodes[i];
                if (node.m_left != -1)
                {
                    CRNLIB_ASSERT(node.m_right != -1);
                    continue;
                }

                CRNLIB_ASSERT((node.m_left == -1) && (node.m_right == -1));

                node.m_codebook_index = m_codebook.size();
                m_codebook.push_back(node.m_centroid);

                m_overall_variance += node.m_variance;
            }

            m_heap.clear();
            m_left_children.clear();
            m_right_children.clear();

            return true;
        }